

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

Uint32 Diligent::FindResource
                 (PipelineResourceDesc *Resources,Uint32 NumResources,SHADER_TYPE ShaderStage,
                 char *ResourceName)

{
  SHADER_TYPE SVar1;
  int iVar2;
  Char *Message;
  PipelineResourceDesc *ResDesc;
  Uint32 r;
  undefined1 local_48 [8];
  string msg;
  char *ResourceName_local;
  SHADER_TYPE ShaderStage_local;
  Uint32 NumResources_local;
  PipelineResourceDesc *Resources_local;
  
  msg.field_2._8_8_ = ResourceName;
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    FormatString<char[26],char[51]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"FindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x163);
    std::__cxx11::string::~string((string *)local_48);
  }
  ResDesc._0_4_ = 0;
  while( true ) {
    if (NumResources <= (uint)ResDesc) {
      return 0xffffffff;
    }
    SVar1 = operator&(Resources[(uint)ResDesc].ShaderStages,ShaderStage);
    if ((SVar1 != SHADER_TYPE_UNKNOWN) &&
       (iVar2 = strcmp(Resources[(uint)ResDesc].Name,(char *)msg.field_2._8_8_), iVar2 == 0)) break;
    ResDesc._0_4_ = (uint)ResDesc + 1;
  }
  return (uint)ResDesc;
}

Assistant:

Uint32 FindResource(const PipelineResourceDesc Resources[],
                    Uint32                     NumResources,
                    SHADER_TYPE                ShaderStage,
                    const char*                ResourceName)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 r = 0; r < NumResources; ++r)
    {
        const PipelineResourceDesc& ResDesc{Resources[r]};
        if ((ResDesc.ShaderStages & ShaderStage) != 0 && strcmp(ResDesc.Name, ResourceName) == 0)
            return r;
    }

    return InvalidPipelineResourceIndex;
}